

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

int my_compare(void *a,void *b)

{
  int iVar1;
  void *b_local;
  void *a_local;
  
  iVar1 = strcmp(*a,"<UNK>");
  if (iVar1 == 0) {
    a_local._4_4_ = -1;
  }
  else {
    iVar1 = strcmp(*b,"<UNK>");
    if (iVar1 == 0) {
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = strcmp(*a,*b);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
my_compare(const void *a, const void *b)
{
    /* Make sure <UNK> floats to the beginning. */
    if (strcmp(*(char *const *) a, "<UNK>") == 0)
        return -1;
    else if (strcmp(*(char *const *) b, "<UNK>") == 0)
        return 1;
    else
        return strcmp(*(char *const *) a, *(char *const *) b);
}